

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_mulr_ps_mips(CPUMIPSState *env,uint64_t fdt0,uint64_t fdt1)

{
  float_status *s;
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar1 = float32_mul_mips((float32)fdt0,(float32)(fdt0 >> 0x20),s);
  fVar2 = float32_mul_mips((float32)fdt1,(float32)(fdt1 >> 0x20),s);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

uint64_t helper_float_mulr_ps(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt1)
{
    uint32_t fst0 = fdt0 & 0XFFFFFFFF;
    uint32_t fsth0 = fdt0 >> 32;
    uint32_t fst1 = fdt1 & 0XFFFFFFFF;
    uint32_t fsth1 = fdt1 >> 32;
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = float32_mul(fst0, fsth0, &env->active_fpu.fp_status);
    fsth2 = float32_mul(fst1, fsth1, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}